

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Geometry2D.cpp
# Opt level: O1

void __thiscall Assimp::X3DImporter::ParseNode_Geometry2D_Disk2D(X3DImporter *this)

{
  size_t *psVar1;
  FIReader *pFVar2;
  char *pcVar3;
  CX3DImporter_NodeElement *pCVar4;
  _List_node_base *p_Var5;
  undefined8 uVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  undefined4 extraout_var_00;
  char *__s;
  undefined4 extraout_var_02;
  undefined7 extraout_var;
  _List_node_base *p_Var10;
  _List_node_base *p_Var11;
  runtime_error *this_00;
  _Alloc_hider _Var12;
  _Self __tmp_1;
  _Self __tmp;
  string *psVar13;
  _List_node_base *p_Var14;
  int pAttrIdx;
  ulong uVar15;
  float fVar16;
  CX3DImporter_NodeElement *ne;
  string an;
  list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> tlist_o;
  list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> tlist_i;
  string use;
  string def;
  CX3DImporter_NodeElement *local_e8;
  float local_dc;
  CX3DImporter_NodeElement *local_d8;
  string local_d0;
  undefined1 local_b0 [16];
  _Alloc_hider local_a0;
  list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_98;
  CX3DImporter_NodeElement *local_80;
  X3DImporter *local_78;
  string local_70;
  string local_50;
  undefined4 extraout_var_01;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_e8 = (CX3DImporter_NodeElement *)0x0;
  uVar8 = (*(((this->mReader)._M_t.
              super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
              super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
              super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
            super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  uVar15 = 0;
  local_78 = this;
  if ((int)uVar8 < 1) {
    local_dc = 0.0;
    local_d8 = (CX3DImporter_NodeElement *)CONCAT44(local_d8._4_4_,0x3f800000);
  }
  else {
    local_d8 = (CX3DImporter_NodeElement *)CONCAT44(local_d8._4_4_,0x3f800000);
    local_dc = 0.0;
    local_80 = (CX3DImporter_NodeElement *)0x0;
    do {
      pFVar2 = (this->mReader)._M_t.
               super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
               super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
               super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
      pAttrIdx = (int)uVar15;
      iVar9 = (*(pFVar2->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                        (pFVar2,uVar15);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,(char *)CONCAT44(extraout_var_00,iVar9),
                 (allocator<char> *)local_b0);
      iVar9 = std::__cxx11::string::compare((char *)&local_d0);
      if (iVar9 == 0) {
        iVar9 = (*(((this->mReader)._M_t.
                    super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                    .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                  super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
        __s = (char *)CONCAT44(extraout_var_01,iVar9);
        psVar13 = &local_50;
LAB_007255c1:
        pcVar3 = (char *)psVar13->_M_string_length;
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)psVar13,0,pcVar3,(ulong)__s);
        this = local_78;
      }
      else {
        iVar9 = std::__cxx11::string::compare((char *)&local_d0);
        if (iVar9 == 0) {
          iVar9 = (*(((this->mReader)._M_t.
                      super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                      .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                    super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
          __s = (char *)CONCAT44(extraout_var_02,iVar9);
          psVar13 = &local_70;
          goto LAB_007255c1;
        }
        iVar9 = std::__cxx11::string::compare((char *)&local_d0);
        if (((iVar9 != 0) && (iVar9 = std::__cxx11::string::compare((char *)&local_d0), iVar9 != 0))
           && (iVar9 = std::__cxx11::string::compare((char *)&local_d0), iVar9 != 0)) {
          iVar9 = std::__cxx11::string::compare((char *)&local_d0);
          if (iVar9 == 0) {
            local_dc = XML_ReadNode_GetAttrVal_AsFloat(this,pAttrIdx);
          }
          else {
            iVar9 = std::__cxx11::string::compare((char *)&local_d0);
            if (iVar9 == 0) {
              fVar16 = XML_ReadNode_GetAttrVal_AsFloat(this,pAttrIdx);
              local_d8 = (CX3DImporter_NodeElement *)CONCAT44(local_d8._4_4_,fVar16);
            }
            else {
              iVar9 = std::__cxx11::string::compare((char *)&local_d0);
              if (iVar9 == 0) {
                bVar7 = XML_ReadNode_GetAttrVal_AsBool(this,pAttrIdx);
                local_80 = (CX3DImporter_NodeElement *)CONCAT71(extraout_var,bVar7);
              }
              else {
                Throw_IncorrectAttr(this,&local_d0);
              }
            }
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      uVar15 = (ulong)(pAttrIdx + 1U);
    } while (uVar8 != pAttrIdx + 1U);
    uVar15 = (ulong)((byte)local_80 & 1);
  }
  if (local_70._M_string_length == 0) {
    local_b0._0_8_ = local_b0;
    local_a0._M_p = (pointer)0x0;
    local_98.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
    _M_node.super__List_node_base._M_next = (_List_node_base *)&local_98;
    local_98.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
    _M_node._M_size = 0;
    local_b0._8_8_ = local_b0._0_8_;
    local_98.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
    _M_node.super__List_node_base._M_prev =
         local_98.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
         _M_node.super__List_node_base._M_next;
    if (local_d8._0_4_ < local_dc) {
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"innerRadius","");
      Throw_IncorrectAttrValue(this,&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
    }
    local_e8 = (CX3DImporter_NodeElement *)operator_new(0x78);
    pCVar4 = this->NodeElement_Cur;
    local_e8->Type = ENET_Disk2D;
    (local_e8->ID)._M_dataplus._M_p = (pointer)&(local_e8->ID).field_2;
    (local_e8->ID)._M_string_length = 0;
    (local_e8->ID).field_2._M_local_buf[0] = '\0';
    local_e8->Parent = pCVar4;
    (local_e8->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_e8->Child;
    (local_e8->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_e8->Child;
    (local_e8->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node._M_size = 0;
    local_e8->_vptr_CX3DImporter_NodeElement =
         (_func_int **)&PTR__CX3DImporter_NodeElement_Geometry2D_009bf810;
    *(CX3DImporter_NodeElement **)&local_e8[1].Type = local_e8 + 1;
    local_e8[1]._vptr_CX3DImporter_NodeElement = (_func_int **)(local_e8 + 1);
    local_e8[1].ID._M_dataplus._M_p = (pointer)0x0;
    local_e8[1].ID.field_2._M_local_buf[0] = '\x01';
    if (local_50._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&local_e8->ID);
    }
    GeometryHelper_Make_Arc2D
              (this,0.0,0.0,local_d8._0_4_,10,
               (list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_b0);
    pCVar4 = local_e8;
    if ((local_dc != 0.0) || (NAN(local_dc))) {
      if ((local_dc != local_d8._0_4_) || (NAN(local_dc) || NAN(local_d8._0_4_))) {
        local_d8 = local_e8 + 1;
        GeometryHelper_Make_Arc2D(this,0.0,0.0,local_dc,10,&local_98);
        if (local_98.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
            _M_impl._M_node._M_size < (_List_node_base *)0x2) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_d0,"Disk2D. Not enough points for creating quad list.","");
          std::runtime_error::runtime_error(this_00,(string *)&local_d0);
          *(undefined ***)this_00 = &PTR__runtime_error_008e3168;
          __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        p_Var10 = (_List_node_base *)local_b0._0_8_;
        p_Var14 = local_98.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                  _M_impl._M_node.super__List_node_base._M_next;
        if (local_98.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
            _M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_98) {
          do {
            p_Var5 = p_Var14->_M_next;
            p_Var11 = (_List_node_base *)operator_new(0x20);
            *(undefined4 *)&p_Var11[1]._M_prev = *(undefined4 *)&p_Var14[1]._M_prev;
            p_Var11[1]._M_next = p_Var14[1]._M_next;
            std::__detail::_List_node_base::_M_hook(p_Var11);
            pCVar4[1].ID._M_dataplus._M_p = pCVar4[1].ID._M_dataplus._M_p + 1;
            p_Var14 = p_Var10->_M_next;
            p_Var11 = (_List_node_base *)operator_new(0x20);
            *(undefined4 *)&p_Var11[1]._M_prev = *(undefined4 *)&p_Var10[1]._M_prev;
            p_Var11[1]._M_next = p_Var10[1]._M_next;
            std::__detail::_List_node_base::_M_hook(p_Var11);
            pCVar4[1].ID._M_dataplus._M_p = pCVar4[1].ID._M_dataplus._M_p + 1;
            p_Var10 = (_List_node_base *)operator_new(0x20);
            *(undefined4 *)&p_Var10[1]._M_prev = *(undefined4 *)&p_Var14[1]._M_prev;
            p_Var10[1]._M_next = p_Var14[1]._M_next;
            std::__detail::_List_node_base::_M_hook(p_Var10);
            pCVar4[1].ID._M_dataplus._M_p = pCVar4[1].ID._M_dataplus._M_p + 1;
            p_Var10 = (_List_node_base *)operator_new(0x20);
            *(undefined4 *)&p_Var10[1]._M_prev = *(undefined4 *)&p_Var5[1]._M_prev;
            p_Var10[1]._M_next = p_Var5[1]._M_next;
            std::__detail::_List_node_base::_M_hook(p_Var10);
            pCVar4[1].ID._M_dataplus._M_p = pCVar4[1].ID._M_dataplus._M_p + 1;
            p_Var10 = p_Var14;
            p_Var14 = p_Var5;
          } while (p_Var5 != (_List_node_base *)&local_98);
        }
        p_Var10 = (_List_node_base *)operator_new(0x20);
        *(undefined4 *)&p_Var10[1]._M_prev = local_80._0_4_;
        p_Var10[1]._M_next =
             (_List_node_base *)
             local_98.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl._M_node._M_size;
        std::__detail::_List_node_base::_M_hook(p_Var10);
        pCVar4[1].ID._M_dataplus._M_p = pCVar4[1].ID._M_dataplus._M_p + 1;
        p_Var10 = (_List_node_base *)operator_new(0x20);
        this = local_78;
        *(undefined4 *)&p_Var10[1]._M_prev =
             local_98.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl._M_node.super__List_node_base._M_next._0_4_;
        p_Var10[1]._M_next = (_List_node_base *)local_a0._M_p;
        std::__detail::_List_node_base::_M_hook(p_Var10);
        uVar6 = local_b0._0_8_;
        pCVar4[1].ID._M_dataplus._M_p = pCVar4[1].ID._M_dataplus._M_p + 1;
        p_Var10 = (_List_node_base *)operator_new(0x20);
        *(undefined4 *)&p_Var10[1]._M_prev =
             *(undefined4 *)&((_List_node_base *)(uVar6 + 0x10))->_M_prev;
        p_Var10[1]._M_next = ((_List_node_base *)(uVar6 + 0x10))->_M_next;
        std::__detail::_List_node_base::_M_hook(p_Var10);
        uVar6 = local_b0._0_8_;
        pCVar4[1].ID._M_dataplus._M_p = pCVar4[1].ID._M_dataplus._M_p + 1;
        p_Var10 = (_List_node_base *)operator_new(0x20);
        *(undefined4 *)&p_Var10[1]._M_prev =
             *(undefined4 *)&((_List_node_base *)(uVar6 + 0x10))->_M_prev;
        p_Var10[1]._M_next = ((_List_node_base *)(uVar6 + 0x10))->_M_next;
        std::__detail::_List_node_base::_M_hook(p_Var10);
        pCVar4[1].ID._M_dataplus._M_p = pCVar4[1].ID._M_dataplus._M_p + 1;
        _Var12._M_p = (pointer)&DAT_00000004;
      }
      else {
        GeometryHelper_Extend_PointToLine
                  (this,(list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_b0,
                   (list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)(local_e8 + 1));
        _Var12._M_p = (pointer)(_List_node_base *)0x2;
      }
    }
    else {
      _Var12._M_p = local_a0._M_p;
      if (local_e8 + 1 != (CX3DImporter_NodeElement *)local_b0) {
        std::__cxx11::list<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
        _M_assign_dispatch<std::_List_const_iterator<aiVector3t<float>>>
                  ((list<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)(local_e8 + 1),
                   local_b0._0_8_);
        _Var12._M_p = local_a0._M_p;
      }
    }
    local_e8[1].ID._M_string_length = (size_type)_Var12._M_p;
    local_e8[1].ID.field_2._M_local_buf[0] = (char)uVar15;
    iVar9 = (*(((this->mReader)._M_t.
                super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t
                .super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
              super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    pCVar4 = local_e8;
    if ((char)iVar9 == '\0') {
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Disk2D","");
      ParseNode_Metadata(this,pCVar4,&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      pCVar4 = this->NodeElement_Cur;
      p_Var10 = (_List_node_base *)operator_new(0x18);
      p_Var10[1]._M_next = (_List_node_base *)local_e8;
      std::__detail::_List_node_base::_M_hook(p_Var10);
      psVar1 = &(pCVar4->Child).
                super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
    }
    p_Var10 = (_List_node_base *)operator_new(0x18);
    p_Var10[1]._M_next = (_List_node_base *)local_e8;
    std::__detail::_List_node_base::_M_hook(p_Var10);
    psVar1 = &(this->NodeElement_List).
              super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    p_Var10 = local_98.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl._M_node.super__List_node_base._M_next;
    while (p_Var14 = (_List_node_base *)local_b0._0_8_, p_Var10 != (_List_node_base *)&local_98) {
      p_Var14 = (((_List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                 &p_Var10->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      operator_delete(p_Var10,0x20);
      p_Var10 = p_Var14;
    }
    while (p_Var14 != (_List_node_base *)local_b0) {
      p_Var10 = p_Var14->_M_next;
      operator_delete(p_Var14,0x20);
      p_Var14 = p_Var10;
    }
  }
  else {
    XML_CheckNode_MustBeEmpty(this);
    if (local_50._M_string_length != 0) {
      Throw_DEF_And_USE(this);
    }
    bVar7 = FindNodeElement(this,&local_70,ENET_Disk2D,&local_e8);
    if (!bVar7) {
      Throw_USE_NotFound(this,&local_70);
    }
    pCVar4 = this->NodeElement_Cur;
    p_Var10 = (_List_node_base *)operator_new(0x18);
    p_Var10[1]._M_next = (_List_node_base *)local_e8;
    std::__detail::_List_node_base::_M_hook(p_Var10);
    psVar1 = &(pCVar4->Child).
              super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void X3DImporter::ParseNode_Geometry2D_Disk2D()
{
    std::string def, use;
    float innerRadius = 0;
    float outerRadius = 1;
    bool solid = false;
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_RET("innerRadius", innerRadius, XML_ReadNode_GetAttrVal_AsFloat);
		MACRO_ATTRREAD_CHECK_RET("outerRadius", outerRadius, XML_ReadNode_GetAttrVal_AsFloat);
		MACRO_ATTRREAD_CHECK_RET("solid", solid, XML_ReadNode_GetAttrVal_AsBool);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_Disk2D, ne);
	}
	else
	{
		std::list<aiVector3D> tlist_o, tlist_i;

		if(innerRadius > outerRadius) Throw_IncorrectAttrValue("innerRadius");

		// create and if needed - define new geometry object.
		ne = new CX3DImporter_NodeElement_Geometry2D(CX3DImporter_NodeElement::ENET_Disk2D, NodeElement_Cur);
		if(!def.empty()) ne->ID = def;

		// create point list of geometry object.
		///TODO: IME - AI_CONFIG for NumSeg
		GeometryHelper_Make_Arc2D(0, 0, outerRadius, 10, tlist_o);// outer circle
		if(innerRadius == 0.0f)
		{// make filled disk
			// in tlist_o we already have points of circle. just copy it and sign as polygon.
			((CX3DImporter_NodeElement_Geometry2D*)ne)->Vertices = tlist_o;
			((CX3DImporter_NodeElement_Geometry2D*)ne)->NumIndices = tlist_o.size();
		}
		else if(innerRadius == outerRadius)
		{// make circle
			// in tlist_o we already have points of circle. convert it to line set.
			GeometryHelper_Extend_PointToLine(tlist_o, ((CX3DImporter_NodeElement_Geometry2D*)ne)->Vertices);
			((CX3DImporter_NodeElement_Geometry2D*)ne)->NumIndices = 2;
		}
		else
		{// make disk
			std::list<aiVector3D>& vlist = ((CX3DImporter_NodeElement_Geometry2D*)ne)->Vertices;// just short alias.

			GeometryHelper_Make_Arc2D(0, 0, innerRadius, 10, tlist_i);// inner circle
			//
			// create quad list from two point lists
			//
			if(tlist_i.size() < 2) throw DeadlyImportError("Disk2D. Not enough points for creating quad list.");// tlist_i and tlist_o has equal size.

			// add all quads except last
			for(std::list<aiVector3D>::iterator it_i = tlist_i.begin(), it_o = tlist_o.begin(); it_i != tlist_i.end();)
			{
				// do not forget - CCW direction
				vlist.push_back(*it_i++);// 1st point
				vlist.push_back(*it_o++);// 2nd point
				vlist.push_back(*it_o);// 3rd point
				vlist.push_back(*it_i);// 4th point
			}

			// add last quad
			vlist.push_back(*tlist_i.end());// 1st point
			vlist.push_back(*tlist_o.end());// 2nd point
			vlist.push_back(*tlist_o.begin());// 3rd point
			vlist.push_back(*tlist_o.begin());// 4th point

			((CX3DImporter_NodeElement_Geometry2D*)ne)->NumIndices = 4;
		}

		((CX3DImporter_NodeElement_Geometry2D*)ne)->Solid = solid;
		// check for X3DMetadataObject childs.
		if(!mReader->isEmptyElement())
			ParseNode_Metadata(ne, "Disk2D");
		else
			NodeElement_Cur->Child.push_back(ne);// add made object as child to current element

		NodeElement_List.push_back(ne);// add element to node element list because its a new object in graph
	}// if(!use.empty()) else
}